

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::RunContext::testGroupEnded
          (RunContext *this,string *testSpec,Totals *totals,size_t groupIndex,size_t groupsCount)

{
  pointer pcVar1;
  int iVar2;
  long *local_d0 [2];
  long local_c0 [2];
  size_t local_b0;
  size_t sStack_a8;
  undefined4 local_a0;
  undefined4 uStack_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  undefined4 local_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 local_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  undefined4 uStack_74;
  undefined1 local_70;
  long *local_68;
  long local_60;
  long local_58 [2];
  size_t local_48;
  size_t sStack_40;
  IStreamingReporter *local_38;
  
  local_38 = (this->m_reporter).m_p;
  local_68 = local_58;
  pcVar1 = (testSpec->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + testSpec->_M_string_length);
  local_48 = groupIndex;
  sStack_40 = groupsCount;
  iVar2 = (*(this->super_IResultCapture)._vptr_IResultCapture[0xb])(this);
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char*>((string *)local_d0,local_68,local_60 + (long)local_68);
  local_b0 = local_48;
  sStack_a8 = sStack_40;
  local_a0 = (undefined4)(totals->assertions).passed;
  uStack_9c = *(undefined4 *)((long)&(totals->assertions).passed + 4);
  uStack_98 = (undefined4)(totals->assertions).failed;
  uStack_94 = *(undefined4 *)((long)&(totals->assertions).failed + 4);
  local_90 = (undefined4)(totals->assertions).failedButOk;
  uStack_8c = *(undefined4 *)((long)&(totals->assertions).failedButOk + 4);
  uStack_88 = (undefined4)(totals->testCases).passed;
  uStack_84 = *(undefined4 *)((long)&(totals->testCases).passed + 4);
  local_80 = (undefined4)(totals->testCases).failed;
  uStack_7c = *(undefined4 *)((long)&(totals->testCases).failed + 4);
  uStack_78 = (undefined4)(totals->testCases).failedButOk;
  uStack_74 = *(undefined4 *)((long)&(totals->testCases).failedButOk + 4);
  local_70 = (undefined1)iVar2;
  (*(local_38->super_IShared).super_NonCopyable._vptr_NonCopyable[0xe])();
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0],local_c0[0] + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  return;
}

Assistant:

void testGroupEnded( std::string const& testSpec, Totals const& totals, std::size_t groupIndex, std::size_t groupsCount ) {
            m_reporter->testGroupEnded( TestGroupStats( GroupInfo( testSpec, groupIndex, groupsCount ), totals, aborting() ) );
        }